

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTSIZEDec(size_t *val,octet *der,size_t count,u32 tag)

{
  octet oVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  octet *der_00;
  u32 t;
  size_t len;
  
  sVar2 = derTDec(&t,der,count);
  sVar5 = 0xffffffffffffffff;
  if ((sVar2 != 0xffffffffffffffff) && (t == tag)) {
    der_00 = der + sVar2;
    sVar3 = derLDec(&len,der_00,count - sVar2);
    if (len < 10 && sVar3 != 0xffffffffffffffff) {
      oVar1 = der_00[sVar3];
      if (-1 < (char)oVar1) {
        if (len < 2 || oVar1 != '\0') {
          if ((len == 9) && (oVar1 != '\0')) {
            return 0xffffffffffffffff;
          }
        }
        else if (-1 < (char)der_00[sVar3 + 1]) {
          return 0xffffffffffffffff;
        }
        uVar4 = 0;
        for (sVar5 = 0; len != sVar5; sVar5 = sVar5 + 1) {
          uVar4 = uVar4 << 8 | (ulong)der_00[sVar5 + sVar3];
        }
        if (val != (size_t *)0x0) {
          *val = uVar4;
        }
        sVar5 = sVar3 + sVar2 + len;
      }
    }
  }
  return sVar5;
}

Assistant:

size_t derTSIZEDec(size_t* val, const octet der[], size_t count, u32 tag)
{
	u32 t;
	size_t t_count;
	size_t l_count;
	size_t len;
	// pre
	ASSERT(memIsNullOrValid(val, O_PER_S));
	ASSERT(val == 0 || memIsDisjoint2(val, O_PER_S, der, count));
	// декодировать T
	t_count = derTDec(&t, der, count);
	if (t_count == SIZE_MAX || t != tag)
		return SIZE_MAX;
	der += t_count, count -= t_count;
	// декодировать L
	l_count = derLDec(&len, der, count);
	if (l_count == SIZE_MAX || len > O_PER_S + 1)
		return SIZE_MAX;
	der += l_count, count -= l_count;
	// декодировать V
	{
		register size_t v = 0;
		size_t pos = 0;
		// в старшем октете установлен старший бит?
		// избыточный нулевой старший октет?
		// переполнение?
		if ((der[0] & 0x80) ||
			der[0] == 0 && len > 1 && (der[1] & 0x80) == 0 ||
			len == O_PER_S + 1 && der[0] != 0)
			return SIZE_MAX;
		// декодировать
		for (; pos < len; ++pos)
			v <<= 8, v |= der[pos];
		if (val)
			*val = v;
		v = 0;
	}
	return t_count + l_count + len;
}